

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

void __thiscall
Clasp::DefaultUnfoundedCheck::reason
          (DefaultUnfoundedCheck *this,Solver *param_1,Literal p,LitVec *r)

{
  ulong in_RAX;
  pointer pLVar1;
  uint uVar2;
  pointer pLVar3;
  undefined8 uStack_28;
  
  uVar2 = (this->activeClause_).ebo_.size;
  if ((uVar2 == 0) || (pLVar1 = (this->activeClause_).ebo_.buf, 1 < (pLVar1->rep_ ^ p.rep_))) {
    uVar2 = (p.rep_ >> 2) - 1;
    pLVar1 = this->reasons_[uVar2].ebo_.buf;
    uVar2 = this->reasons_[uVar2].ebo_.size;
    pLVar3 = pLVar1;
  }
  else {
    pLVar3 = pLVar1 + 1;
  }
  if (pLVar3 != pLVar1 + uVar2) {
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT44(pLVar3->rep_,(undefined4)uStack_28) & 0xfffffffeffffffff ^ 0x200000000;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                (r,(Literal *)((long)&uStack_28 + 4));
      pLVar3 = pLVar3 + 1;
    } while (pLVar3 != pLVar1 + uVar2);
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::reason(Solver&, Literal p, LitVec& r) {
	LitVec::const_iterator it, end;
	if (!activeClause_.empty() && activeClause_[0] == p) {
		it  = activeClause_.begin()+1;
		end = activeClause_.end();
	}
	else {
		assert(strategy_ == only_reason && reasons_);
		it  = reasons_[p.var()-1].begin();
		end = reasons_[p.var()-1].end();
	}
	for (; it != end; ++it) r.push_back( ~*it );
}